

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdtarga.c
# Opt level: O0

JDIMENSION preload_image(j_compress_ptr cinfo,cjpeg_source_ptr sinfo)

{
  FILE *__stream;
  undefined8 *puVar1;
  int iVar2;
  JDIMENSION JVar3;
  undefined8 *puVar4;
  size_t sVar5;
  long in_RSI;
  long *in_RDI;
  cd_progress_ptr progress;
  JDIMENSION row;
  JSAMPARRAY image_ptr;
  JSAMPROW out_ptr;
  FILE *infile;
  bmp_source_ptr source;
  uint local_34;
  
  __stream = *(FILE **)(in_RSI + 0x18);
  puVar1 = (undefined8 *)in_RDI[2];
  for (local_34 = 0; local_34 < *(uint *)((long)in_RDI + 0x34); local_34 = local_34 + 1) {
    if (puVar1 != (undefined8 *)0x0) {
      puVar1[1] = (ulong)local_34;
      puVar1[2] = (ulong)*(uint *)((long)in_RDI + 0x34);
      (*(code *)*puVar1)(in_RDI);
    }
    puVar4 = (undefined8 *)
             (**(code **)(in_RDI[1] + 0x38))(in_RDI,*(undefined8 *)(in_RSI + 0x40),local_34,1);
    sVar5 = fread((void *)*puVar4,1,(ulong)*(uint *)(in_RSI + 0x4c),__stream);
    if (sVar5 != *(uint *)(in_RSI + 0x4c)) {
      iVar2 = feof(__stream);
      if (iVar2 == 0) {
        *(undefined4 *)(*in_RDI + 0x28) = 0x24;
        (**(code **)*in_RDI)(in_RDI);
      }
      else {
        *(undefined4 *)(*in_RDI + 0x28) = 0x2b;
        (**(code **)*in_RDI)(in_RDI);
      }
    }
  }
  if (puVar1 != (undefined8 *)0x0) {
    *(int *)(puVar1 + 4) = *(int *)(puVar1 + 4) + 1;
  }
  iVar2 = *(int *)(in_RSI + 0x50);
  if (iVar2 == 8) {
    *(code **)(in_RSI + 8) = get_8bit_row;
  }
  else if (iVar2 == 0x18) {
    *(code **)(in_RSI + 8) = get_24bit_row;
  }
  else if (iVar2 == 0x20) {
    *(code **)(in_RSI + 8) = get_32bit_row;
  }
  else {
    *(undefined4 *)(*in_RDI + 0x28) = 0x3ea;
    (**(code **)*in_RDI)(in_RDI);
  }
  *(undefined4 *)(in_RSI + 0x48) = *(undefined4 *)((long)in_RDI + 0x34);
  JVar3 = (**(code **)(in_RSI + 8))(in_RDI,in_RSI);
  return JVar3;
}

Assistant:

METHODDEF(JDIMENSION)
preload_image(j_compress_ptr cinfo, cjpeg_source_ptr sinfo)
{
  tga_source_ptr source = (tga_source_ptr)sinfo;
  JDIMENSION row;
  cd_progress_ptr progress = (cd_progress_ptr)cinfo->progress;

  /* Read the data into a virtual array in input-file row order. */
  for (row = 0; row < cinfo->image_height; row++) {
    if (progress != NULL) {
      progress->pub.pass_counter = (long)row;
      progress->pub.pass_limit = (long)cinfo->image_height;
      (*progress->pub.progress_monitor) ((j_common_ptr)cinfo);
    }
    source->pub.buffer = (*cinfo->mem->access_virt_sarray)
      ((j_common_ptr)cinfo, source->whole_image, row, (JDIMENSION)1, TRUE);
    (*source->get_pixel_rows) (cinfo, sinfo);
  }
  if (progress != NULL)
    progress->completed_extra_passes++;

  /* Set up to read from the virtual array in unscrambled order */
  source->pub.get_pixel_rows = get_memory_row;
  source->current_row = 0;
  /* And read the first row */
  return get_memory_row(cinfo, sinfo);
}